

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npn.hpp
# Opt level: O0

tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* kitty::
  exact_npn_canonization<kitty::static_truth_table<4u,true>,void(kitty::static_truth_table<4u,true>const&)>
            (static_truth_table<4U,_true> *tt,_func_void_static_truth_table<4U,_true>_ptr *fn)

{
  byte bVar1;
  initializer_list<unsigned_char> __l;
  bool bVar2;
  static_truth_table<4U,_true> *psVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  allocator_type *__a;
  byte *pbVar7;
  reference __b;
  code *in_RDX;
  static_truth_table<4U,_true> *in_RSI;
  tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDI;
  int i_3;
  uint32_t phase;
  value_type pos_3;
  int i_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> perm;
  value_type pos_2;
  size_t i_1;
  value_type pos_1;
  size_t j;
  value_type pos;
  size_t i;
  int best_flip;
  int best_swap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flips;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *swaps;
  bool invo;
  static_truth_table<4U,_true> tmin;
  static_truth_table<4U,_true> t2;
  static_truth_table<4U,_true> t1;
  uint64_t bit1;
  uint64_t bit;
  uint num_vars;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe50;
  static_truth_table<4U,_true> *in_stack_fffffffffffffe58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe60;
  undefined1 *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe70;
  allocator_type *in_stack_fffffffffffffe78;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe80;
  iterator puVar9;
  size_type in_stack_fffffffffffffe90;
  int local_158;
  int local_14c;
  undefined1 local_131;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  uint8_t local_111;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_110;
  uint8_t local_101;
  ulong local_100;
  uint8_t local_f1;
  ulong local_f0;
  int local_e8;
  int local_e4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  undefined1 local_c9;
  uint64_t local_c8;
  static_truth_table<4U,_true> local_c0;
  static_truth_table<4U,_true> local_b8;
  uchar local_aa [2];
  uchar *local_a8;
  undefined8 local_a0;
  int local_7c;
  uint64_t local_78;
  uint64_t local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_34;
  uint64_t local_30;
  uint64_t local_28;
  uint local_1c;
  code *local_18;
  static_truth_table<4U,_true> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = static_truth_table<4U,_true>::num_vars(in_RSI);
  if (local_1c == 0) {
    local_28 = get_bit<4u>(local_10,0);
    local_30 = (uint64_t)
               unary_not_if<kitty::static_truth_table<4u,true>>
                         (in_stack_fffffffffffffe58,
                          SUB81((ulong)in_stack_fffffffffffffe50._M_current >> 0x38,0));
    local_34 = (undefined4)local_28;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x118f14);
    std::
    make_tuple<kitty::static_truth_table<4u,true>,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe50._M_current,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe48._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffe60);
  }
  else if (local_1c == 1) {
    local_70 = get_bit<4u>(local_10,1);
    local_78 = (uint64_t)
               unary_not_if<kitty::static_truth_table<4u,true>>
                         (in_stack_fffffffffffffe58,
                          SUB81((ulong)in_stack_fffffffffffffe50._M_current >> 0x38,0));
    local_7c = (int)local_70 * 2;
    local_aa[1] = 0;
    local_a8 = local_aa + 1;
    local_a0 = 1;
    puVar9 = local_aa;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x119001);
    __l._M_len = in_stack_fffffffffffffe90;
    __l._M_array = puVar9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffe80,__l,in_stack_fffffffffffffe78);
    std::
    make_tuple<kitty::static_truth_table<4u,true>,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe50._M_current,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe48._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffe60);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x119063);
  }
  else {
    local_b8._bits = local_10->_bits;
    local_c0 = operator~<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current);
    psVar3 = std::min<kitty::static_truth_table<4u,true>>
                       ((static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current,
                        (static_truth_table<4U,_true> *)0x1190ee);
    local_c8 = psVar3->_bits;
    local_c9 = operator==<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe50._M_current,
                              (static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current);
    (*local_18)(&local_b8);
    (*local_18)(&local_c0);
    local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (detail::swaps + (ulong)(local_1c - 2) * 0x18);
    local_e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (detail::flips + (ulong)(local_1c - 2) * 0x18);
    local_e4 = -1;
    local_e8 = -1;
    local_f0 = 0;
    while (uVar8 = local_f0,
          sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8),
          uVar8 < sVar4) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_d8,local_f0);
      local_f1 = *pvVar5;
      swap_adjacent_inplace<4u>(&local_b8,local_f1);
      swap_adjacent_inplace<4u>(&local_c0,local_f1);
      (*local_18)(&local_b8);
      (*local_18)(&local_c0);
      bVar2 = operator<<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe50._M_current,
                            (static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current);
      if ((bVar2) ||
         (bVar2 = operator<<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe50._M_current
                                ,(static_truth_table<4U,_true> *)
                                 in_stack_fffffffffffffe48._M_current), bVar2)) {
        local_e4 = (int)local_f0;
        psVar3 = std::min<kitty::static_truth_table<4u,true>>
                           ((static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current,
                            (static_truth_table<4U,_true> *)0x119288);
        local_c8 = psVar3->_bits;
        local_c9 = operator==<4U>((static_truth_table<4U,_true> *)
                                  in_stack_fffffffffffffe50._M_current,
                                  (static_truth_table<4U,_true> *)
                                  in_stack_fffffffffffffe48._M_current);
      }
      local_f0 = local_f0 + 1;
    }
    local_100 = 0;
    while (uVar8 = local_100,
          sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e0),
          uVar8 < sVar4) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_e0,local_100);
      local_101 = *pvVar5;
      swap_adjacent_inplace<4u>(&local_b8,'\0');
      flip_inplace<4u>(&local_b8,local_101);
      swap_adjacent_inplace<4u>(&local_c0,'\0');
      flip_inplace<4u>(&local_c0,local_101);
      (*local_18)(&local_b8);
      (*local_18)(&local_c0);
      bVar2 = operator<<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe50._M_current,
                            (static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current);
      if ((bVar2) ||
         (bVar2 = operator<<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe50._M_current
                                ,(static_truth_table<4U,_true> *)
                                 in_stack_fffffffffffffe48._M_current), bVar2)) {
        local_e4 = -1;
        local_e8 = (int)local_100;
        psVar3 = std::min<kitty::static_truth_table<4u,true>>
                           ((static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current,
                            (static_truth_table<4U,_true> *)0x1193ea);
        local_c8 = psVar3->_bits;
        local_c9 = operator==<4U>((static_truth_table<4U,_true> *)
                                  in_stack_fffffffffffffe50._M_current,
                                  (static_truth_table<4U,_true> *)
                                  in_stack_fffffffffffffe48._M_current);
      }
      local_110 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
      while (in_stack_fffffffffffffe70 = local_110,
            pvVar6 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8),
            in_stack_fffffffffffffe70 < pvVar6) {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (local_d8,(size_type)local_110);
        local_111 = *pvVar5;
        swap_adjacent_inplace<4u>(&local_b8,local_111);
        swap_adjacent_inplace<4u>(&local_c0,local_111);
        (*local_18)(&local_b8);
        (*local_18)(&local_c0);
        bVar2 = operator<<4U>((static_truth_table<4U,_true> *)in_stack_fffffffffffffe50._M_current,
                              (static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current);
        if ((bVar2) ||
           (bVar2 = operator<<4U>((static_truth_table<4U,_true> *)
                                  in_stack_fffffffffffffe50._M_current,
                                  (static_truth_table<4U,_true> *)
                                  in_stack_fffffffffffffe48._M_current), bVar2)) {
          local_e4 = (int)local_110;
          local_e8 = (int)local_100;
          psVar3 = std::min<kitty::static_truth_table<4u,true>>
                             ((static_truth_table<4U,_true> *)in_stack_fffffffffffffe48._M_current,
                              (static_truth_table<4U,_true> *)0x119517);
          local_c8 = psVar3->_bits;
          local_c9 = operator==<4U>((static_truth_table<4U,_true> *)
                                    in_stack_fffffffffffffe50._M_current,
                                    (static_truth_table<4U,_true> *)
                                    in_stack_fffffffffffffe48._M_current);
        }
        local_110 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)&(local_110->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_100 = local_100 + 1;
    }
    __a = (allocator_type *)(ulong)local_1c;
    __n = &local_131;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x119594);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffe70,(size_type)__n,__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1195ba);
    pvVar6 = &local_130;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe48._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe48._M_current);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_int>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
    for (local_14c = 0; local_14c <= local_e4; local_14c = local_14c + 1) {
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_d8,(long)local_14c);
      bVar1 = *pbVar7;
      in_stack_fffffffffffffe50._M_current =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_130,(ulong)bVar1);
      __b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&local_130,(long)(int)(bVar1 + 1));
      std::swap<unsigned_char>(in_stack_fffffffffffffe50._M_current,__b);
    }
    for (local_158 = 0; local_158 <= local_e8; local_158 = local_158 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (local_e0,(long)local_158);
    }
    std::
    make_tuple<kitty::static_truth_table<4u,true>&,unsigned_int&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((static_truth_table<4U,_true> *)pvVar6,(uint *)in_stack_fffffffffffffe50._M_current,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe48._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
  }
  return in_RDI;
}

Assistant:

std::tuple<TT, uint32_t, std::vector<uint8_t>> exact_npn_canonization( const TT& tt, Callback&& fn = detail::exact_npn_canonization_null_callback<TT> )
{
  static_assert( is_complete_truth_table<TT>::value, "Can only be applied on complete truth tables." );

  const auto num_vars = tt.num_vars();

  /* Special case for n = 0 */
  if ( num_vars == 0 )
  {
    const auto bit = get_bit( tt, 0 );
    return std::make_tuple( unary_not_if( tt, bit ), static_cast<uint32_t>( bit ), std::vector<uint8_t>{} );
  }

  /* Special case for n = 1 */
  if ( num_vars == 1 )
  {
    const auto bit1 = get_bit( tt, 1 );
    return std::make_tuple( unary_not_if( tt, bit1 ), static_cast<uint32_t>( bit1 << 1 ), std::vector<uint8_t>{ 0 } );
  }

  assert( num_vars >= 2 && num_vars <= 6 );

  auto t1 = tt, t2 = ~tt;
  auto tmin = std::min( t1, t2 );
  auto invo = tmin == t2;

  fn( t1 );
  fn( t2 );

  const auto& swaps = detail::swaps[num_vars - 2u];
  const auto& flips = detail::flips[num_vars - 2u];

  int best_swap = -1;
  int best_flip = -1;

  for ( std::size_t i = 0; i < swaps.size(); ++i )
  {
    const auto pos = swaps[i];
    swap_adjacent_inplace( t1, pos );
    swap_adjacent_inplace( t2, pos );

    fn( t1 );
    fn( t2 );

    if ( t1 < tmin || t2 < tmin )
    {
      best_swap = static_cast<int>( i );
      tmin = std::min( t1, t2 );
      invo = tmin == t2;
    }
  }

  for ( std::size_t j = 0; j < flips.size(); ++j )
  {
    const auto pos = flips[j];
    swap_adjacent_inplace( t1, 0 );
    flip_inplace( t1, pos );
    swap_adjacent_inplace( t2, 0 );
    flip_inplace( t2, pos );

    fn( t1 );
    fn( t2 );

    if ( t1 < tmin || t2 < tmin )
    {
      best_swap = -1;
      best_flip = static_cast<int>( j );
      tmin = std::min( t1, t2 );
      invo = tmin == t2;
    }

    for ( std::size_t i = 0; i < swaps.size(); ++i )
    {
      const auto pos = swaps[i];
      swap_adjacent_inplace( t1, pos );
      swap_adjacent_inplace( t2, pos );

      fn( t1 );
      fn( t2 );

      if ( t1 < tmin || t2 < tmin )
      {
        best_swap = static_cast<int>( i );
        best_flip = static_cast<int>( j );
        tmin = std::min( t1, t2 );
        invo = tmin == t2;
      }
    }
  }

  std::vector<uint8_t> perm( num_vars );
  std::iota( perm.begin(), perm.end(), 0u );

  for ( auto i = 0; i <= best_swap; ++i )
  {
    const auto pos = swaps[i];
    std::swap( perm[pos], perm[pos + 1] );
  }

  uint32_t phase = uint32_t( invo ) << num_vars;
  for ( auto i = 0; i <= best_flip; ++i )
  {
    phase ^= 1 << flips[i];
  }

  return std::make_tuple( tmin, phase, perm );
}